

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
::AssertHashEqConsistent<google::protobuf::FileDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
           *this,FileDescriptor **key)

{
  undefined1 auVar1 [16];
  FileDescriptor *pFVar2;
  FileDescriptor *pFVar3;
  uint uVar4;
  long lVar5;
  undefined1 *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  uintptr_t v;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  uintptr_t v_3;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
              *)this);
  if ((1 < *(ulong *)(this + 8)) && (uVar9 = *(ulong *)this, uVar9 < 0x11)) {
    pFVar2 = *key;
    uVar7 = ((ulong)pFVar2 ^ 0x589848) * -0x234dd359734ecb13;
    uVar7 = (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
             (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
             (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)pFVar2;
    pauVar10 = *(undefined1 (**) [16])(this + 0x10);
    lVar8 = *(long *)(this + 0x18);
    if (uVar9 < 0xf) {
      if (8 < uVar9) {
        __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x78b,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                     );
      }
      uVar9 = *(ulong *)(*pauVar10 + uVar9) & 0x8080808080808080;
      if (uVar9 != 0x8080808080808080) {
        uVar9 = uVar9 ^ 0x8080808080808080;
        do {
          lVar5 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          pFVar3 = *(FileDescriptor **)(lVar8 + -0x20 + (ulong)((uint)lVar5 & 0xfffffff8) * 4);
          if ((pFVar3 == pFVar2) &&
             (uVar12 = ((ulong)pFVar3 ^ 0x589848) * -0x234dd359734ecb13,
             uVar7 != ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                        (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                        (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                        (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38) ^ (ulong)pFVar3))) {
LAB_001ea09b:
            __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xfbf,
                          "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::AssertHashEqConsistent(const google::protobuf::FileDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                         );
          }
          uVar9 = uVar9 & uVar9 - 1;
        } while (uVar9 != 0);
      }
    }
    else {
      uVar9 = *(ulong *)(this + 8) >> 1;
      while( true ) {
        auVar1 = *pauVar10;
        uVar11 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
        if (uVar11 != 0xffff) {
          uVar11 = ~uVar11;
          do {
            uVar4 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            if ((char)(*pauVar10)[uVar4] < '\0') {
              __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x79d,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
            pFVar3 = *(FileDescriptor **)(lVar8 + (ulong)(uVar4 << 5));
            if ((pFVar3 == pFVar2) &&
               (uVar12 = ((ulong)pFVar3 ^ 0x589848) * -0x234dd359734ecb13,
               uVar7 != ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38) ^ (ulong)pFVar3)))
            goto LAB_001ea09b;
            uVar9 = uVar9 - 1;
            uVar13 = (ushort)(uVar11 - 1) & (ushort)uVar11;
            uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar13);
          } while (uVar13 != 0);
        }
        if (uVar9 == 0) break;
        lVar8 = lVar8 + 0x200;
        puVar6 = *pauVar10;
        pauVar10 = pauVar10 + 1;
        if (puVar6[0xf] == -1) {
          __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7a5,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

void AssertHashEqConsistent(const K& key) {
#ifdef NDEBUG
    return;
#endif
    // If the hash/eq functors are known to be consistent, then skip validation.
    if (std::is_same<hasher, absl::container_internal::StringHash>::value &&
        std::is_same<key_equal, absl::container_internal::StringEq>::value) {
      return;
    }
    if (std::is_scalar<key_type>::value &&
        std::is_same<hasher, absl::Hash<key_type>>::value &&
        std::is_same<key_equal, std::equal_to<key_type>>::value) {
      return;
    }
    if (empty()) return;

    const size_t hash_of_arg = hash_ref()(key);
    const auto assert_consistent = [&](const ctrl_t*, slot_type* slot) {
      const value_type& element = PolicyTraits::element(slot);
      const bool is_key_equal =
          PolicyTraits::apply(EqualElement<K>{key, eq_ref()}, element);
      if (!is_key_equal) return;

      const size_t hash_of_slot =
          PolicyTraits::apply(HashElement{hash_ref()}, element);
      ABSL_ATTRIBUTE_UNUSED const bool is_hash_equal =
          hash_of_arg == hash_of_slot;
      assert((!is_key_equal || is_hash_equal) &&
             "eq(k1, k2) must imply that hash(k1) == hash(k2). "
             "hash/eq functors are inconsistent.");
    };

    if (is_soo()) {
      assert_consistent(/*unused*/ nullptr, soo_slot());
      return;
    }
    // We only do validation for small tables so that it's constant time.
    if (capacity() > 16) return;
    IterateOverFullSlots(common(), slot_array(), assert_consistent);
  }